

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,LoopStatement *l)

{
  FunctionBuilder *this_00;
  uint index;
  uint32_t uVar1;
  VariableDeclaration *this_01;
  Expression *pEVar2;
  Variable *pVVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  char cVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  Structure *pSVar10;
  int64_t iVar11;
  long *plVar12;
  Variable *pVVar13;
  Expression *pEVar14;
  Constant *pCVar15;
  BinaryOperator *pBVar16;
  undefined4 extraout_var;
  size_type *psVar17;
  uint uVar18;
  StructurePtr SVar19;
  Type type;
  pool_ptr<soul::AST::Constant> constNumIterations;
  Type local_250;
  undefined1 local_238 [16];
  StructurePtr SStack_228;
  StructurePtr local_218;
  Block *local_210;
  Structure *local_208;
  Block *local_200;
  int32_t local_1f4;
  CodeLocation local_1f0;
  CodeLocation local_1e0;
  Type local_1d0;
  string local_1b8;
  long local_198;
  string local_190;
  Type local_170;
  Block *local_158;
  Block *pBStack_150;
  pool_ptr<soul::heart::Block> local_140;
  pool_ptr<soul::heart::Block> local_138;
  pool_ptr<soul::heart::Block> local_130;
  pool_ptr<soul::heart::Block> local_128;
  pool_ptr<soul::heart::Block> local_120;
  pool_ptr<soul::heart::Block> local_118;
  pool_ptr<soul::heart::Block> local_110;
  pool_ptr<soul::heart::Block> local_108;
  pool_ptr<soul::heart::Block> local_100;
  pool_ptr<soul::heart::Block> local_f8;
  pool_ptr<soul::heart::Block> local_f0;
  pool_ptr<soul::heart::Block> local_e8;
  Value local_e0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  index = this->loopIndex;
  this->loopIndex = index + 1;
  local_158 = (this->breakTarget).object;
  pBStack_150 = (this->continueTarget).object;
  this_00 = &this->builder;
  pSVar10 = (Structure *)FunctionBuilder::createBlock(this_00,"@break_",index);
  local_200 = FunctionBuilder::createBlock(this_00,"@cont_",index);
  (this->breakTarget).object = (Block *)pSVar10;
  (this->continueTarget).object = local_200;
  local_218.object = pSVar10;
  local_210 = FunctionBuilder::createBlock(this_00,"@loop_",index);
  pSVar10 = (Structure *)FunctionBuilder::createBlock(this_00,"@body_",index);
  this_01 = (l->rangeLoopInitialiser).object;
  if (this_01 == (VariableDeclaration *)0x0) {
    pEVar2 = (l->numIterations).object;
    if (pEVar2 == (Expression *)0x0) {
      local_118.object = local_210;
      FunctionBuilder::beginBlock(this_00,&local_118);
      pEVar2 = (l->condition).object;
      if (pEVar2 == (Expression *)0x0) {
        local_120.object = (Block *)pSVar10;
        FunctionBuilder::addBranch(this_00,(Block *)pSVar10,&local_120);
      }
      else {
        (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_250);
        if (local_250._0_8_ == 0) {
          pEVar2 = (l->condition).object;
          if (pEVar2 == (Expression *)0x0) {
            throwInternalCompilerError("object != nullptr","operator*",0x3b);
          }
          local_130.object = (Block *)pSVar10;
          addBranchIf(this,pEVar2,(Block *)pSVar10,(Block *)local_218.object,&local_130);
        }
        else {
          soul::Value::getData((PackedData *)local_238,(Value *)(local_250._0_8_ + 0x30));
          bVar8 = soul::Value::PackedData::getAsBool((PackedData *)local_238);
          SVar19.object = local_218.object;
          if (bVar8) {
            SVar19.object = pSVar10;
          }
          local_128.object = (Block *)pSVar10;
          FunctionBuilder::addBranch(this_00,(Block *)SVar19.object,&local_128);
        }
      }
      if ((l->body).object != (Statement *)0x0) {
        pp_Var4 = (this->super_ASTVisitor)._vptr_ASTVisitor;
        pVVar13 = (this->currentTargetVariable).object;
        uVar1 = this->expressionDepth;
        (this->currentTargetVariable).object = (Variable *)0x0;
        this->expressionDepth = 0;
        (*pp_Var4[4])(this);
        (this->currentTargetVariable).object = pVVar13;
        this->expressionDepth = uVar1;
      }
      local_138.object = local_200;
      FunctionBuilder::beginBlock(this_00,&local_138);
      if ((l->iterator).object != (Statement *)0x0) {
        pp_Var4 = (this->super_ASTVisitor)._vptr_ASTVisitor;
        pVVar13 = (this->currentTargetVariable).object;
        uVar1 = this->expressionDepth;
        (this->currentTargetVariable).object = (Variable *)0x0;
        this->expressionDepth = 0;
        (*pp_Var4[4])(this);
        (this->currentTargetVariable).object = pVVar13;
        this->expressionDepth = uVar1;
      }
    }
    else {
      if ((l->condition).object != (Expression *)0x0 || (l->iterator).object != (Statement *)0x0) {
        throwInternalCompilerError("l.iterator == nullptr && l.condition == nullptr","visit",0x33a);
      }
      (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_250);
      if ((1 < local_250.primitiveType.type - int32) || (local_250.category != primitive)) {
        pEVar2 = (l->numIterations).object;
        if (pEVar2 == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        CompileMessageHelpers::createMessage<>(&local_a0,syntax,error,"Expected an integer");
        AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_a0,false)
        ;
      }
      local_1d0.primitiveType.type = int32;
      if (local_250.primitiveType.type == int64) {
        pEVar2 = (l->numIterations).object;
        if (pEVar2 == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_198);
        if (local_198 != 0) {
          soul::Value::getData((PackedData *)local_238,(Value *)(local_198 + 0x30));
          iVar11 = soul::Value::PackedData::getAsInt64((PackedData *)local_238);
          SVar19.object = local_250.structure.object;
          if (iVar11 < 0x80000000) {
            local_250.category = primitive;
            local_250.arrayElementCategory = invalid;
            local_250.isRef = false;
            local_250.isConstant = false;
            local_250.primitiveType.type = int32;
            local_250.boundingSize = 0;
            local_250.arrayElementBoundingSize = 0;
            if (local_250.structure.object != (Structure *)0x0) {
              local_250.structure.object = (Structure *)0x0;
              RefCountedPtr<soul::Structure>::decIfNotNull(SVar19.object);
            }
            RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
          }
        }
        local_1d0.primitiveType.type = local_250.primitiveType.type;
      }
      uVar5 = local_250._0_8_;
      local_1d0.category = local_250.category;
      local_1d0.arrayElementCategory = local_250.arrayElementCategory;
      local_1d0.isRef = local_250.isRef;
      local_1d0.isConstant = local_250.isConstant;
      local_1d0.boundingSize = local_250.boundingSize;
      local_1d0.arrayElementBoundingSize = local_250.arrayElementBoundingSize;
      local_1d0.structure.object = local_250.structure.object;
      if (local_250.structure.object != (Structure *)0x0) {
        ((local_250.structure.object)->super_RefCountedObject).refCount =
             ((local_250.structure.object)->super_RefCountedObject).refCount + 1;
      }
      cVar7 = '\x01';
      if (9 < index) {
        uVar18 = index;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          if (uVar18 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_0021774b;
          }
          if (uVar18 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_0021774b;
          }
          if (uVar18 < 10000) goto LAB_0021774b;
          bVar8 = 99999 < uVar18;
          uVar18 = uVar18 / 10000;
          cVar6 = cVar7 + '\x04';
        } while (bVar8);
        cVar7 = cVar7 + '\x01';
      }
LAB_0021774b:
      local_250._0_8_ = uVar5;
      local_238._0_8_ = (Type *)&SStack_228;
      local_208 = pSVar10;
      std::__cxx11::string::_M_construct((ulong)local_238,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_238._0_8_,local_238._8_4_,index)
      ;
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,0x27ec36);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_1b8.field_2._M_allocated_capacity = *psVar17;
        local_1b8.field_2._8_8_ = plVar12[3];
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar17;
        local_1b8._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_1b8._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pVVar13 = BlockBuilder::createMutableLocalVariable
                          (&this_00->super_BlockBuilder,&local_1d0,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if ((Type *)local_238._0_8_ != (Type *)&SStack_228) {
        operator_delete((void *)local_238._0_8_,
                        (ulong)((long)&((SStack_228.object)->super_RefCountedObject).refCount + 1));
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_1d0.structure.object);
      pEVar2 = (l->numIterations).object;
      if (pEVar2 == (Expression *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      pEVar14 = evaluateAsExpression(this,pEVar2);
      pEVar14 = BlockBuilder::createCastIfNeeded
                          ((this->builder).super_BlockBuilder.module,pEVar14,&local_250);
      BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar13->super_Expression,pEVar14);
      local_100.object = local_210;
      FunctionBuilder::beginBlock(this_00,&local_100);
      local_1f0.sourceCode.object =
           (l->super_Statement).super_ASTObject.context.location.sourceCode.object;
      if (local_1f0.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_1f0.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_1f0.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_1f0.location.data = (l->super_Statement).super_ASTObject.context.location.location.data;
      pCVar15 = heart::Allocator::allocateZeroInitialiser
                          (((this->builder).super_BlockBuilder.module)->allocator,&local_250);
      local_238._0_4_ = 0xe;
      pBVar16 = PoolAllocator::
                allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                          (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_1f0,
                           &pVVar13->super_Expression,&pCVar15->super_Expression,(Op *)local_238);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1f0.sourceCode.object);
      local_108.object = (Block *)local_208;
      FunctionBuilder::addBranchIf
                (this_00,&pBVar16->super_Expression,(Block *)local_208,(Block *)local_218.object,
                 &local_108);
      if ((l->body).object != (Statement *)0x0) {
        pp_Var4 = (this->super_ASTVisitor)._vptr_ASTVisitor;
        pVVar3 = (this->currentTargetVariable).object;
        uVar1 = this->expressionDepth;
        (this->currentTargetVariable).object = (Variable *)0x0;
        this->expressionDepth = 0;
        (*pp_Var4[4])(this);
        (this->currentTargetVariable).object = pVVar3;
        this->expressionDepth = uVar1;
      }
      local_110.object = local_200;
      FunctionBuilder::beginBlock(this_00,&local_110);
      pEVar14 = BlockBuilder::createIntegerChangedByOne
                          (&this_00->super_BlockBuilder,&pVVar13->super_Expression,subtract);
      BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar13->super_Expression,pEVar14);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_250.structure.object);
    }
  }
  else {
    if ((l->condition).object != (Expression *)0x0 || (l->iterator).object != (Statement *)0x0) {
      throwInternalCompilerError("l.iterator == nullptr && l.condition == nullptr","visit",799);
    }
    AST::VariableDeclaration::getType(&local_250,this_01);
    if ((local_250.category & ~primitive) != wrap) {
      CompileMessageHelpers::createMessage<>
                (&local_68,syntax,error,
                 "A range-based-for loop must declare a variable with a \'wrap\' type");
      AST::Context::throwError(&(this_01->super_Statement).super_ASTObject.context,&local_68,false);
    }
    local_1f4 = local_250.boundingSize;
    local_170.category = primitive;
    local_170.arrayElementCategory = invalid;
    local_170.isRef = false;
    local_170.isConstant = false;
    local_170.primitiveType.type = int32;
    local_170.boundingSize = 0;
    local_170.arrayElementBoundingSize = 0;
    local_170.structure.object = (Structure *)0x0;
    cVar7 = '\x01';
    if (9 < index) {
      uVar18 = index;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar18 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_002173cf;
        }
        if (uVar18 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_002173cf;
        }
        if (uVar18 < 10000) goto LAB_002173cf;
        bVar8 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar8);
      cVar7 = cVar7 + '\x01';
    }
LAB_002173cf:
    local_238._0_8_ = &SStack_228;
    local_208 = pSVar10;
    std::__cxx11::string::_M_construct((ulong)local_238,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_238._0_8_,local_238._8_4_,index);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,0x27ec36);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_190.field_2._M_allocated_capacity = *psVar17;
      local_190.field_2._8_8_ = plVar12[3];
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *psVar17;
      local_190._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_190._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pVVar13 = BlockBuilder::createMutableLocalVariable
                        (&this_00->super_BlockBuilder,&local_170,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((Type *)local_238._0_8_ != (Type *)&SStack_228) {
      operator_delete((void *)local_238._0_8_,
                      (ulong)((long)&((SStack_228.object)->super_RefCountedObject).refCount + 1));
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(local_170.structure.object);
    if ((this_01->initialValue).object == (Expression *)0x0) {
      BlockBuilder::addZeroAssignment(&this_00->super_BlockBuilder,&pVVar13->super_Expression);
    }
    else {
      pVVar3 = (this_01->generatedVariable).object;
      if (pVVar3 == (Variable *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      local_238._0_8_ = (Type *)0x700000001;
      local_238._8_8_ = (uint8_t *)0x0;
      SStack_228.object = (Structure *)0x0;
      pEVar14 = BlockBuilder::createCastIfNeeded
                          ((this->builder).super_BlockBuilder.module,&pVVar3->super_Expression,
                           (Type *)local_238);
      BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar13->super_Expression,pEVar14);
      RefCountedPtr<soul::Structure>::decIfNotNull(SStack_228.object);
    }
    local_e8.object = local_210;
    FunctionBuilder::beginBlock(this_00,&local_e8);
    local_1e0.sourceCode.object =
         (l->super_Statement).super_ASTObject.context.location.sourceCode.object;
    if (local_1e0.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_1e0.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_1e0.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_1e0.location.data = (l->super_Statement).super_ASTObject.context.location.location.data;
    soul::Value::Value(&local_e0,local_1f4);
    pCVar15 = BlockBuilder::createConstant(&this_00->super_BlockBuilder,&local_e0);
    local_238._0_4_ = 0xc;
    pBVar16 = PoolAllocator::
              allocate<soul::heart::BinaryOperator,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                        (&((this->builder).super_BlockBuilder.module)->allocator->pool,&local_1e0,
                         &pVVar13->super_Expression,&pCVar15->super_Expression,(Op *)local_238);
    soul::Value::~Value(&local_e0);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1e0.sourceCode.object);
    local_f0.object = (Block *)local_208;
    FunctionBuilder::addBranchIf
              (this_00,&pBVar16->super_Expression,(Block *)local_208,(Block *)local_218.object,
               &local_f0);
    pVVar3 = (this_01->generatedVariable).object;
    if (pVVar3 == (Variable *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    iVar9 = (*(pVVar3->super_Expression).super_Object._vptr_Object[2])(pVVar3);
    pEVar14 = BlockBuilder::createCastIfNeeded
                        ((this->builder).super_BlockBuilder.module,&pVVar13->super_Expression,
                         (Type *)CONCAT44(extraout_var,iVar9));
    BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar3->super_Expression,pEVar14);
    if ((l->body).object != (Statement *)0x0) {
      pp_Var4 = (this->super_ASTVisitor)._vptr_ASTVisitor;
      pVVar3 = (this->currentTargetVariable).object;
      uVar1 = this->expressionDepth;
      (this->currentTargetVariable).object = (Variable *)0x0;
      this->expressionDepth = 0;
      (*pp_Var4[4])(this);
      (this->currentTargetVariable).object = pVVar3;
      this->expressionDepth = uVar1;
    }
    local_f8.object = local_200;
    FunctionBuilder::beginBlock(this_00,&local_f8);
    pEVar14 = BlockBuilder::createIntegerChangedByOne
                        (&this_00->super_BlockBuilder,&pVVar13->super_Expression,add);
    BlockBuilder::addAssignment(&this_00->super_BlockBuilder,&pVVar13->super_Expression,pEVar14);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_250.structure.object);
  }
  local_140.object = (Block *)local_218.object;
  FunctionBuilder::addBranch(this_00,local_210,&local_140);
  (this->breakTarget).object = local_158;
  (this->continueTarget).object = pBStack_150;
  return;
}

Assistant:

void visit (AST::LoopStatement& l) override
    {
        auto labelIndex = loopIndex++;
        auto oldbreakTarget = breakTarget;
        auto oldcontinueTarget = continueTarget;
        auto& breakBlock    = builder.createBlock ("@break_", labelIndex);
        auto& continueBlock = builder.createBlock ("@cont_",  labelIndex);

        breakTarget = breakBlock;
        continueTarget = continueBlock;

        auto& startBlock = builder.createBlock ("@loop_", labelIndex);
        auto& bodyBlock  = builder.createBlock ("@body_", labelIndex);

        if (auto rangeLoopVar = l.rangeLoopInitialiser)
        {
            SOUL_ASSERT (l.iterator == nullptr && l.condition == nullptr);
            auto type = rangeLoopVar->getType();

            if (! type.isBoundedInt())
                rangeLoopVar->context.throwError (Errors::rangeBasedForMustBeWrapType());

            auto numIterations = type.getBoundedIntLimit();
            auto& counterVar = builder.createMutableLocalVariable (Type::getBoundedIntSizeType(), "$counter_" + std::to_string (labelIndex));

            if (auto init = rangeLoopVar->initialValue)
                builder.addAssignment (counterVar, builder.createCastIfNeeded (rangeLoopVar->getGeneratedVariable(), Type::getBoundedIntSizeType()));
            else
                builder.addZeroAssignment (counterVar);

            builder.beginBlock (startBlock);
            auto& isCounterInRange = builder.createBinaryOp (l.context.location, counterVar,
                                                             builder.createConstant (Value (numIterations)),
                                                             BinaryOp::Op::lessThan);
            builder.addBranchIf (isCounterInRange, bodyBlock, breakBlock, bodyBlock);

            builder.addCastOrAssignment (rangeLoopVar->getGeneratedVariable(), counterVar);
            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            builder.incrementValue (counterVar);
        }
        else if (l.numIterations != nullptr)
        {
            SOUL_ASSERT (l.iterator == nullptr && l.condition == nullptr);
            auto indexType = l.numIterations->getResultType();

            if (! indexType.isPrimitiveInteger())
                l.numIterations->context.throwError (Errors::expectedInteger());

            if (indexType.isInteger64())
            {
                if (auto constNumIterations = l.numIterations->getAsConstant())
                {
                    auto num = constNumIterations->value.getAsInt64();

                    if (num <= 0x7fffffff)
                        indexType = PrimitiveType::int32;
                }
            }

            auto& counterVar = builder.createMutableLocalVariable (indexType, "$counter_" + std::to_string (labelIndex));
            builder.addAssignment (counterVar, builder.createCastIfNeeded (evaluateAsExpression (*l.numIterations), indexType));

            builder.beginBlock (startBlock);
            auto& isCounterInRange = builder.createBinaryOp (l.context.location, counterVar,
                                                             builder.createZeroInitialiser (indexType),
                                                             BinaryOp::Op::greaterThan);
            builder.addBranchIf (isCounterInRange, bodyBlock, breakBlock, bodyBlock);
            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            builder.decrementValue (counterVar);
        }
        else
        {
            builder.beginBlock (startBlock);

            if (l.condition == nullptr)
                builder.addBranch (bodyBlock, bodyBlock);
            else if (auto c = l.condition->getAsConstant())
                builder.addBranch (c->value.getAsBool() ? bodyBlock : breakBlock, bodyBlock);
            else
                addBranchIf (*l.condition, bodyBlock, breakBlock, bodyBlock);

            visitAsStatement (l.body);
            builder.beginBlock (continueBlock);
            visitAsStatement (l.iterator);
        }

        builder.addBranch (startBlock, breakBlock);
        breakTarget = oldbreakTarget;
        continueTarget = oldcontinueTarget;
    }